

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_224::GlobalUseScanner::visitFunction(GlobalUseScanner *this,Function *curr)

{
  Expression *condition;
  bool bVar1;
  Block *pBVar2;
  ExpressionList *this_00;
  size_t sVar3;
  Expression **ppEVar4;
  mapped_type *pmVar5;
  undefined1 local_48 [8];
  Name global;
  If *iff;
  ExpressionList *list;
  Block *block;
  Function *local_18;
  Function *curr_local;
  GlobalUseScanner *this_local;
  
  block._4_4_ = 0;
  local_18 = curr;
  curr_local = (Function *)this;
  bVar1 = wasm::Type::operator!=(&curr->body->type,(BasicType *)((long)&block + 4));
  if ((!bVar1) &&
     (pBVar2 = Expression::dynCast<wasm::Block>(local_18->body), pBVar2 != (Block *)0x0)) {
    this_00 = &pBVar2->list;
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&this_00->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    if (sVar3 == 2) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,0);
      global.super_IString.str._M_str = (char *)Expression::dynCast<wasm::If>(*ppEVar4);
      if ((((If *)global.super_IString.str._M_str != (If *)0x0) &&
          (((If *)global.super_IString.str._M_str)->ifFalse == (Expression *)0x0)) &&
         (bVar1 = Expression::is<wasm::Return>(((If *)global.super_IString.str._M_str)->ifTrue),
         bVar1)) {
        condition = *(Expression **)(global.super_IString.str._M_str + 0x10);
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,1);
        _local_48 = (string_view)readsGlobalOnlyToWriteIt(this,condition,*ppEVar4);
        bVar1 = IString::is((IString *)local_48);
        if (bVar1) {
          pmVar5 = std::
                   map<wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo>_>_>
                   ::operator[](this->infos,(key_type *)local_48);
          std::__atomic_base<unsigned_int>::operator++
                    (&(pmVar5->readOnlyToWrite).super___atomic_base<unsigned_int>,0);
        }
      }
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // We are looking for a function body like this:
    //
    //   if (global == X) return;
    //   global = Y;
    //
    // And nothing else at all. Note that this does not overlap with the if
    // pattern above (the assignment is in the if body) so we will never have
    // overlapping matchings (which would each count as 1, leading to a
    // miscount).

    if (curr->body->type != Type::none) {
      return;
    }

    auto* block = curr->body->dynCast<Block>();
    if (!block) {
      return;
    }

    auto& list = block->list;
    if (list.size() != 2) {
      return;
    }

    auto* iff = list[0]->dynCast<If>();
    if (!iff || iff->ifFalse || !iff->ifTrue->is<Return>()) {
      return;
    }

    auto global = readsGlobalOnlyToWriteIt(iff->condition, list[1]);
    if (global.is()) {
      // This is exactly the pattern we sought!
      (*infos)[global].readOnlyToWrite++;
    }
  }